

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O2

bool __thiscall DMessageBoxMenu::MouseEvent(DMessageBoxMenu *this,int type,int x,int y)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  if (this->mMessageMode == 1) {
    if (type == 0) {
LAB_003365cb:
      iVar3 = (*(this->super_DMenu).super_DObject._vptr_DObject[8])(this,6,1);
      return SUB41(iVar3,0);
    }
    bVar1 = false;
  }
  else {
    iVar3 = ((screen->super_DSimpleCanvas).super_DCanvas.Width / -2 + x) / CleanXfac + 0xa0;
    uVar4 = 0xffffffff;
    if ((this->mMouseLeft <= iVar3) && (iVar3 <= this->mMouseRight)) {
      iVar2 = ((screen->super_DSimpleCanvas).super_DCanvas.Height / -2 + y) / CleanYfac + 100;
      iVar3 = this->mMouseY;
      if ((iVar3 <= iVar2) && (iVar5 = SmallFont->FontHeight + 1, iVar2 < iVar3 + iVar5 * 2)) {
        uVar4 = (uint)(iVar3 + iVar5 <= iVar2);
      }
    }
    this->messageSelection = uVar4;
    bVar1 = true;
    if (type == 2) goto LAB_003365cb;
  }
  return bVar1;
}

Assistant:

bool DMessageBoxMenu::MouseEvent(int type, int x, int y)
{
	if (mMessageMode == 1)
	{
		if (type == MOUSE_Click)
		{
			return MenuEvent(MKEY_Enter, true);
		}
		return false;
	}
	else
	{
		int sel = -1;
		int fh = SmallFont->GetHeight() + 1;

		// convert x/y from screen to virtual coordinates, according to CleanX/Yfac use in DrawTexture
		x = ((x - (screen->GetWidth() / 2)) / CleanXfac) + 160;
		y = ((y - (screen->GetHeight() / 2)) / CleanYfac) + 100;

		if (x >= mMouseLeft && x <= mMouseRight && y >= mMouseY && y < mMouseY + 2 * fh)
		{
			sel = y >= mMouseY + fh;
		}
		if (sel != -1 && sel != messageSelection)
		{
			//S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
		}
		messageSelection = sel;
		if (type == MOUSE_Release)
		{
			return MenuEvent(MKEY_Enter, true);
		}
		return true;
	}
}